

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool Js::FunctionProxy::SetDisplayName
               (char16 *srcName,char16 **destName,uint displayNameLength,
               ScriptContext *scriptContext,SetDisplayNameFlags flags)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  char16_t *pcVar5;
  TrackAllocData local_60;
  uint local_38;
  SetDisplayNameFlags local_34;
  uint numCharacters;
  SetDisplayNameFlags flags_local;
  ScriptContext *scriptContext_local;
  char16 **ppcStack_20;
  uint displayNameLength_local;
  char16 **destName_local;
  char16 *srcName_local;
  
  local_34 = flags;
  _numCharacters = scriptContext;
  scriptContext_local._4_4_ = displayNameLength;
  ppcStack_20 = destName;
  destName_local = (char16 **)srcName;
  if (destName == (char16 **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xaf9,"(destName)","destName");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (_numCharacters == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xafa,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (destName_local == (char16 **)0x0) {
    *ppcStack_20 = L"";
    srcName_local._7_1_ = false;
  }
  else {
    bVar2 = IsConstantFunctionName((char16 *)destName_local);
    if ((bVar2) || ((local_34 & SetDisplayNameFlagsDontCopy) != SetDisplayNameFlagsNone)) {
      *ppcStack_20 = (char16 *)destName_local;
      srcName_local._7_1_ =
           (local_34 & SetDisplayNameFlagsRecyclerAllocated) != SetDisplayNameFlagsNone;
    }
    else {
      local_38 = scriptContext_local._4_4_ + 1;
      if ((local_34 & SetDisplayNameFlagsDontCopy) != SetDisplayNameFlagsNone) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0xb09,"((flags & SetDisplayNameFlagsDontCopy) == 0)",
                                    "(flags & SetDisplayNameFlagsDontCopy) == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      pRVar4 = ScriptContext::GetRecycler(_numCharacters);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_60,(type_info *)&char16_t::typeinfo,0,(ulong)local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                 ,0xb0b);
      pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,&local_60);
      pcVar5 = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                         ((Memory *)pRVar4,(Recycler *)Memory::Recycler::AllocLeaf,0,(ulong)local_38
                         );
      *ppcStack_20 = pcVar5;
      js_wmemcpy_s(*ppcStack_20,(ulong)local_38,(char16 *)destName_local,(ulong)local_38);
      (*ppcStack_20)[local_38 - 1] = L'\0';
      srcName_local._7_1_ = true;
    }
  }
  return srcName_local._7_1_;
}

Assistant:

bool FunctionProxy::SetDisplayName(const char16* srcName, const char16** destName, uint displayNameLength,  ScriptContext * scriptContext, SetDisplayNameFlags flags /* default to None */)
    {
        Assert(destName);
        Assert(scriptContext);

        if (srcName == nullptr)
        {
            *destName = (_u(""));
            return false;
        }
        else if (IsConstantFunctionName(srcName) || (flags & SetDisplayNameFlagsDontCopy) != 0)
        {
            *destName = srcName;
            return (flags & SetDisplayNameFlagsRecyclerAllocated) != 0; // Return true if array is recycler allocated
        }
        else
        {
            uint  numCharacters =  displayNameLength + 1;
            Assert((flags & SetDisplayNameFlagsDontCopy) == 0);

            *destName = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, numCharacters);
            js_wmemcpy_s((char16 *)*destName, numCharacters, srcName, numCharacters);
            ((char16 *)(*destName))[numCharacters - 1] = _u('\0');

            return true;
        }
    }